

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

bool __thiscall
Protocol::MQTT::V5::Properties::checkPropertiesFor(Properties *this,ControlPacketType type)

{
  bool bVar1;
  PropertyBase *local_28;
  PropertyBase *u;
  ControlPacketType type_local;
  Properties *this_local;
  
  bVar1 = check(this);
  if (bVar1) {
    for (local_28 = this->head; local_28 != (PropertyBase *)0x0; local_28 = local_28->next) {
      bVar1 = isAllowedProperty((uint)local_28->type,type);
      if (!bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool checkPropertiesFor(const ControlPacketType type) const
                {
                    if (!check()) return false;
                    PropertyBase * u = head;
                    while (u) { if (!isAllowedProperty((PropertyType)u->type, type)) return false; u = u->next; }
                    return true;
                }